

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

longlong toIntegral<long_long>(QStringView string,bool *ok,int base)

{
  bool bVar1;
  QVarLengthArray<unsigned_char,_256LL> *this;
  QVarLengthArray<unsigned_char,_256LL> *c;
  undefined4 in_ECX;
  long in_RDX;
  long in_FS_OFFSET;
  QSimpleParsedNumber<long_long> QVar2;
  QSimpleParsedNumber<long_long> r;
  QVarLengthArray<unsigned_char,_256LL> latin1;
  char16_t *in_stack_fffffffffffffe78;
  longlong lVar3;
  QVarLengthArray<unsigned_char,_256LL> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  QByteArrayView in_stack_fffffffffffffeb0;
  QSimpleParsedNumber<long_long> local_140;
  QStringView local_130;
  undefined1 local_120 [256];
  QVLABase<unsigned_char> QStack_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_120,0xaa,0x118);
  QStringView::size(&local_130);
  QVarLengthArray<unsigned_char,_256LL>::QVarLengthArray
            (in_stack_fffffffffffffe80,(qsizetype)in_stack_fffffffffffffe78);
  this = (QVarLengthArray<unsigned_char,_256LL> *)QVLABase<unsigned_char>::data(&QStack_20);
  c = (QVarLengthArray<unsigned_char,_256LL> *)QStringView::utf16(&local_130);
  QStringView::size(&local_130);
  qt_to_latin1((uchar *)this,in_stack_fffffffffffffe78,0x1505c7);
  local_140.result = -0x5555555555555556;
  local_140.used = -0x5555555555555556;
  QByteArrayView::QByteArrayView<QVarLengthArray<unsigned_char,_256LL>,_true>
            ((QByteArrayView *)CONCAT44(in_ECX,in_stack_fffffffffffffe90),c);
  QVar2 = QLocaleData::bytearrayToLongLong(in_stack_fffffffffffffeb0,(int)((ulong)c >> 0x20));
  local_140.result = QVar2.result;
  local_140.used = QVar2.used;
  if (in_RDX != 0) {
    bVar1 = QSimpleParsedNumber<long_long>::ok(&local_140);
    *(bool *)in_RDX = bVar1;
  }
  lVar3 = local_140.result;
  QVarLengthArray<unsigned_char,_256LL>::~QVarLengthArray(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return lVar3;
  }
  __stack_chk_fail();
}

Assistant:

static Int toIntegral(QStringView string, bool *ok, int base)
{
#if defined(QT_CHECK_RANGE)
    if (base != 0 && (base < 2 || base > 36)) {
        qWarning("QString::toIntegral: Invalid base (%d)", base);
        base = 10;
    }
#endif

    QVarLengthArray<uchar> latin1(string.size());
    qt_to_latin1(latin1.data(), string.utf16(), string.size());
    QSimpleParsedNumber<Int> r;
    if constexpr (std::is_signed_v<Int>)
        r = QLocaleData::bytearrayToLongLong(latin1, base);
    else
        r = QLocaleData::bytearrayToUnsLongLong(latin1, base);
    if (ok)
        *ok = r.ok();
    return r.result;
}